

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::draw_image
          (Fl_PostScript_Graphics_Driver *this,Fl_Draw_Image_Cb call,void *data,int ix,int iy,int iw
          ,int ih,int D)

{
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint a;
  uint a2;
  uchar b;
  uchar g;
  uchar r;
  uchar *curdata_1;
  uchar *curdata;
  void *big;
  uchar *curmask;
  uchar *rgbdata;
  char *pcStack_68;
  int LD;
  char *interpol;
  int k;
  int j;
  int i;
  int level2_mask;
  double h;
  double w;
  double y;
  double x;
  int iw_local;
  int iy_local;
  int ix_local;
  void *data_local;
  Fl_Draw_Image_Cb call_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  dVar6 = (double)ix;
  dVar7 = (double)iy;
  dVar8 = (double)iw;
  dVar9 = (double)ih;
  bVar1 = false;
  fprintf((FILE *)this->output,"save\n");
  if (this->lang_level_ < 2) {
    fprintf((FILE *)this->output,"%g %g %g %g %i %i CI",dVar6,dVar7 + dVar9,dVar8,-dVar9,
            (ulong)(uint)iw,(ulong)(uint)ih);
  }
  else {
    if (this->interpolate_ == 0) {
      pcStack_68 = "false";
    }
    else {
      pcStack_68 = "true";
    }
    if ((this->mask == (uchar *)0x0) || (this->lang_level_ < 3)) {
      if ((this->mask == (uchar *)0x0) || (this->lang_level_ != 2)) {
        fprintf((FILE *)this->output,"%g %g %g %g %i %i %s CII\n",dVar6,dVar7 + dVar9,dVar8,-dVar9,
                (ulong)(uint)iw,(ulong)(uint)ih,pcStack_68);
      }
      else {
        bVar1 = true;
        fprintf((FILE *)this->output," %g %g %g %g %d %d pixmap_plot\n",dVar6,dVar7,dVar8,dVar9,
                (ulong)(uint)iw,(ulong)(uint)ih);
      }
    }
    else {
      fprintf((FILE *)this->output,"%g %g %g %g %i %i %i %i %s CIM\n",dVar6,dVar7 + dVar9,dVar8,
              -dVar9,(ulong)(uint)iw,(ulong)(uint)ih,(ulong)(uint)this->mx,(ulong)(uint)this->my,
              pcStack_68);
    }
  }
  pbVar5 = (byte *)operator_new__((long)(iw * D));
  big = this->mask;
  curdata = (uchar *)prepare_rle85(this);
  if (bVar1) {
    for (interpol._4_4_ = ih + -1; -1 < interpol._4_4_; interpol._4_4_ = interpol._4_4_ + -1) {
      (*call)(data,0,interpol._4_4_,iw,pbVar5);
      curdata_1 = pbVar5;
      for (k = 0; k < iw; k = k + 1) {
        write_rle85(this,*curdata_1,curdata);
        write_rle85(this,curdata_1[1],curdata);
        write_rle85(this,curdata_1[2],curdata);
        curdata_1 = curdata_1 + D;
      }
    }
    close_rle85(this,curdata);
    fputc(10,(FILE *)this->output);
    curdata = (uchar *)prepare_rle85(this);
    for (interpol._4_4_ = ih + -1; -1 < interpol._4_4_; interpol._4_4_ = interpol._4_4_ + -1) {
      big = this->mask + interpol._4_4_ * (this->my / ih) * ((this->mx + 7) / 8);
      for (interpol._0_4_ = 0; (int)interpol < this->my / ih; interpol._0_4_ = (int)interpol + 1) {
        for (k = 0; k < (this->mx + 7) / 8; k = k + 1) {
          uVar2 = swap_byte(*big);
          write_rle85(this,uVar2,curdata);
          big = (void *)((long)big + 1);
        }
      }
    }
  }
  else {
    for (interpol._4_4_ = 0; interpol._4_4_ < ih; interpol._4_4_ = interpol._4_4_ + 1) {
      if ((this->mask != (uchar *)0x0) && (2 < this->lang_level_)) {
        for (interpol._0_4_ = 0; (int)interpol < this->my / ih; interpol._0_4_ = (int)interpol + 1)
        {
          for (k = 0; k < (this->mx + 7) / 8; k = k + 1) {
            uVar2 = swap_byte(*big);
            write_rle85(this,uVar2,curdata);
            big = (void *)((long)big + 1);
          }
        }
      }
      (*call)(data,0,interpol._4_4_,iw,pbVar5);
      _a2 = pbVar5;
      for (k = 0; k < iw; k = k + 1) {
        a._3_1_ = *_a2;
        a._2_1_ = _a2[1];
        a._1_1_ = _a2[2];
        if ((this->lang_level_ < 3) && (3 < D)) {
          uVar3 = (uint)_a2[3];
          iVar4 = 0xff - uVar3;
          a._3_1_ = (byte)((ulong)(uVar3 * a._3_1_ + (uint)this->bg_r * iVar4) / 0xff);
          a._2_1_ = (byte)((ulong)(uVar3 * a._2_1_ + (uint)this->bg_g * iVar4) / 0xff);
          a._1_1_ = (byte)((ulong)(uVar3 * a._1_1_ + (uint)this->bg_b * iVar4) / 0xff);
        }
        write_rle85(this,a._3_1_,curdata);
        write_rle85(this,a._2_1_,curdata);
        write_rle85(this,a._1_1_,curdata);
        _a2 = _a2 + D;
      }
    }
  }
  close_rle85(this,curdata);
  fprintf((FILE *)this->output,"\nrestore\n");
  if (pbVar5 != (byte *)0x0) {
    operator_delete__(pbVar5);
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw_image(Fl_Draw_Image_Cb call, void *data, int ix, int iy, int iw, int ih, int D) {
  double x = ix, y = iy, w = iw, h = ih;

  int level2_mask = 0;
  fprintf(output,"save\n");
  int i,j,k;
  const char * interpol;
  if (lang_level_ > 1) {
    if (interpolate_) interpol="true";
    else interpol="false";
    if (mask && lang_level_ > 2) {
      fprintf(output, "%g %g %g %g %i %i %i %i %s CIM\n", x , y+h , w , -h , iw , ih, mx, my, interpol);
    }
    else if (mask && lang_level_ == 2) {
      level2_mask = 1; // use method for drawing masked color image with PostScript level 2
      fprintf(output, " %g %g %g %g %d %d pixmap_plot\n", x, y, w, h, iw, ih);
    }
    else {
      fprintf(output, "%g %g %g %g %i %i %s CII\n", x , y+h , w , -h , iw , ih, interpol);
    }
  } else {
    fprintf(output , "%g %g %g %g %i %i CI", x , y+h , w , -h , iw , ih);
  }
  
  int LD=iw*D;
  uchar *rgbdata=new uchar[LD];
  uchar *curmask=mask;
  void *big = prepare_rle85();
  
  if (level2_mask) {
    for (j = ih - 1; j >= 0; j--) { // output full image data
      call(data, 0, j, iw, rgbdata);
      uchar *curdata = rgbdata;
      for (i=0 ; i<iw ; i++) {
        write_rle85(curdata[0], big); write_rle85(curdata[1], big); write_rle85(curdata[2], big);
        curdata += D;
      }
    }
    close_rle85(big); fputc('\n', output);
    big = prepare_rle85();
    for (j = ih - 1; j >= 0; j--) { // output mask data
      curmask = mask + j * (my/ih) * ((mx+7)/8);
      for (k=0; k < my/ih; k++) {
        for (i=0; i < ((mx+7)/8); i++) {
          write_rle85(swap_byte(*curmask), big);
          curmask++;
        }
      }
    }
  }
  else {
    for (j=0; j<ih;j++) {
      if (mask && lang_level_ > 2) {  // InterleaveType 2 mask data
        for (k=0; k<my/ih;k++) { //for alpha pseudo-masking
          for (i=0; i<((mx+7)/8);i++) {
            write_rle85(swap_byte(*curmask), big);
            curmask++;
          }
        }
      }
      call(data,0,j,iw,rgbdata);
      uchar *curdata=rgbdata;
      for (i=0 ; i<iw ; i++) {
        uchar r = curdata[0];
        uchar g =  curdata[1];
        uchar b =  curdata[2];
        
        if (lang_level_<3 && D>3) { //can do  mixing using bg_* colors)
          unsigned int a2 = curdata[3]; //must be int
          unsigned int a = 255-a2;
          r = (a2 * r + bg_r * a)/255;
          g = (a2 * g + bg_g * a)/255;
          b = (a2 * b + bg_b * a)/255;
        }
        
        write_rle85(r, big); write_rle85(g, big); write_rle85(b, big);
        curdata +=D;
      }
      
    }
  }
  close_rle85(big);
  fprintf(output,"\nrestore\n");
  delete[] rgbdata;
}